

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::FString(FString *this,char *head,FString *tail)

{
  size_t len;
  size_t sVar1;
  size_t len2;
  size_t len1;
  FString *tail_local;
  char *head_local;
  FString *this_local;
  
  len = strlen(head);
  sVar1 = Len(tail);
  AllocBuffer(this,len + sVar1);
  StrCopy(this->Chars,head,len);
  StrCopy(this->Chars + len,tail);
  return;
}

Assistant:

FString::FString (const char *head, const FString &tail)
{
	size_t len1 = strlen (head);
	size_t len2 = tail.Len();
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head, len1);
	StrCopy (Chars + len1, tail);
}